

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O0

void print_externtype(wasm_externtype_t *type)

{
  undefined1 uVar1;
  wasm_mutability_t mut;
  wasm_valtype_vec_t *pwVar2;
  wasm_valtype_t *pwVar3;
  undefined8 uVar4;
  wasm_limits_t *pwVar5;
  wasm_memorytype_t *memorytype;
  wasm_tabletype_t *tabletype;
  wasm_globaltype_t *globaltype;
  wasm_functype_t *functype;
  wasm_externtype_t *type_local;
  
  uVar1 = wasm_externtype_kind(type);
  switch(uVar1) {
  case 0:
    uVar4 = wasm_externtype_as_functype_const(type);
    printf("func ");
    pwVar2 = (wasm_valtype_vec_t *)wasm_functype_params(uVar4);
    print_valtypes(pwVar2);
    printf(" -> ");
    pwVar2 = (wasm_valtype_vec_t *)wasm_functype_results(uVar4);
    print_valtypes(pwVar2);
    break;
  case 1:
    uVar4 = wasm_externtype_as_globaltype_const(type);
    printf("global ");
    mut = wasm_globaltype_mutability(uVar4);
    print_mutability(mut);
    printf(" ");
    pwVar3 = (wasm_valtype_t *)wasm_globaltype_content(uVar4);
    print_valtype(pwVar3);
    break;
  case 2:
    uVar4 = wasm_externtype_as_tabletype_const(type);
    printf("table ");
    pwVar5 = (wasm_limits_t *)wasm_tabletype_limits(uVar4);
    print_limits(pwVar5);
    printf(" ");
    pwVar3 = (wasm_valtype_t *)wasm_tabletype_element(uVar4);
    print_valtype(pwVar3);
    break;
  case 3:
    uVar4 = wasm_externtype_as_memorytype_const(type);
    printf("memory ");
    pwVar5 = (wasm_limits_t *)wasm_memorytype_limits(uVar4);
    print_limits(pwVar5);
  }
  return;
}

Assistant:

void print_externtype(const wasm_externtype_t* type) {
  switch (wasm_externtype_kind(type)) {
    case WASM_EXTERN_FUNC: {
      const wasm_functype_t* functype =
        wasm_externtype_as_functype_const(type);
      printf("func ");
      print_valtypes(wasm_functype_params(functype));
      printf(" -> ");
      print_valtypes(wasm_functype_results(functype));
    } break;
    case WASM_EXTERN_GLOBAL: {
      const wasm_globaltype_t* globaltype =
        wasm_externtype_as_globaltype_const(type);
      printf("global ");
      print_mutability(wasm_globaltype_mutability(globaltype));
      printf(" ");
      print_valtype(wasm_globaltype_content(globaltype));
    } break;
    case WASM_EXTERN_TABLE: {
      const wasm_tabletype_t* tabletype =
        wasm_externtype_as_tabletype_const(type);
      printf("table ");
      print_limits(wasm_tabletype_limits(tabletype));
      printf(" ");
      print_valtype(wasm_tabletype_element(tabletype));
    } break;
    case WASM_EXTERN_MEMORY: {
      const wasm_memorytype_t* memorytype =
        wasm_externtype_as_memorytype_const(type);
      printf("memory ");
      print_limits(wasm_memorytype_limits(memorytype));
    } break;
  }
}